

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_from_base64(char *base64,wally_psbt **output)

{
  int iVar1;
  uchar *bytes_out;
  size_t max_len;
  size_t written;
  size_t local_30;
  ulong local_28;
  
  if (output == (wally_psbt **)0x0) {
    iVar1 = -2;
  }
  else {
    *output = (wally_psbt *)0x0;
    iVar1 = wally_base64_get_maximum_length(base64,0,&local_30);
    if (iVar1 == 0) {
      bytes_out = (uchar *)wally_malloc(local_30);
      if (bytes_out == (uchar *)0x0) {
        iVar1 = -3;
      }
      else {
        iVar1 = wally_base64_to_bytes(base64,0,bytes_out,local_30,&local_28);
        if (iVar1 == 0) {
          iVar1 = -2;
          if ((5 < local_28) && (iVar1 = -1, local_28 <= local_30)) {
            iVar1 = wally_psbt_from_bytes(bytes_out,local_28,output);
          }
        }
        clear_and_free(bytes_out,local_30);
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_psbt_from_base64(const char *base64, struct wally_psbt **output)
{
    unsigned char *decoded;
    size_t max_len, written;
    int ret;

    TX_CHECK_OUTPUT;
    if ((ret = wally_base64_get_maximum_length(base64, 0, &max_len)) != WALLY_OK)
        return ret;

    /* Allocate the buffer to decode into */
    if ((decoded = wally_malloc(max_len)) == NULL)
        return WALLY_ENOMEM;

    /* Decode the base64 psbt into binary */
    if ((ret = wally_base64_to_bytes(base64, 0, decoded, max_len, &written)) != WALLY_OK)
        goto done;

    if (written <= sizeof(PSBT_MAGIC)) {
        ret = WALLY_EINVAL; /* Not enough bytes for the magic + any data */
        goto done;
    }
    if (written > max_len) {
        ret = WALLY_ERROR; /* Max len too small, should never happen! */
        goto done;
    }

    /* decode the psbt */
    ret = wally_psbt_from_bytes(decoded, written, output);

done:
    clear_and_free(decoded, max_len);
    return ret;
}